

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

int __thiscall
QStyleSheetStyle::pixelMetric(QStyleSheetStyle *this,PixelMetric m,QStyleOption *opt,QWidget *w)

{
  QLatin1StringView sh;
  undefined1 *puVar1;
  bool bVar2;
  Int IVar3;
  Int IVar4;
  int iVar5;
  QStyle *pQVar6;
  QToolButton *pQVar7;
  QStyleOptionToolButton *pQVar8;
  QStyleSheetBoxData *pQVar9;
  QCheckBox *pQVar10;
  QStyleOptionSlider *pQVar11;
  QTabWidget *pQVar12;
  QStyleSheetBorderData *pQVar13;
  int *piVar14;
  long in_RCX;
  QStyleOption *in_RDX;
  int in_ESI;
  QStyleSheetStyle *in_RDI;
  long in_FS_OFFSET;
  int width;
  bool horizontal;
  QWidget *tabWidget;
  QStyleOptionSlider *sb_1;
  QStyleOptionSlider *sb;
  PseudoElement ps_1;
  PseudoElement ps;
  QStyleOptionToolButton *tbOpt;
  QFontMetrics fm;
  QSize sz_5;
  QSize size;
  QSize msz_1;
  QSize sz_4;
  QSize sz_3;
  QSize sz_2;
  QSize msz;
  QSize sz_1;
  QSize sz;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRenderRule subRule_5;
  QRenderRule subRule_4;
  QRenderRule subRule_3;
  QRenderRule subRule_2;
  QRenderRule subRule_1;
  QRenderRule subRule;
  QRenderRule rule;
  QVariant styleHint;
  int in_stack_fffffffffffff3d8;
  ToolButtonFeature in_stack_fffffffffffff3dc;
  int in_stack_fffffffffffff3e0;
  int in_stack_fffffffffffff3e4;
  undefined4 in_stack_fffffffffffff3e8;
  int in_stack_fffffffffffff3ec;
  undefined4 in_stack_fffffffffffff3f0;
  undefined4 in_stack_fffffffffffff3f4;
  undefined4 in_stack_fffffffffffff3f8;
  undefined4 in_stack_fffffffffffff3fc;
  int local_bf8;
  undefined4 in_stack_fffffffffffff420;
  undefined4 in_stack_fffffffffffff424;
  undefined4 in_stack_fffffffffffff428;
  undefined4 in_stack_fffffffffffff42c;
  int local_bd0;
  int local_bc8;
  int local_bc0;
  int local_bb8;
  undefined8 in_stack_fffffffffffff4a0;
  QObject *in_stack_fffffffffffff4a8;
  int local_b3c;
  undefined4 in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4ec;
  undefined8 in_stack_fffffffffffff4f0;
  int element;
  QObject *in_stack_fffffffffffff4f8;
  QFontMetrics local_af8 [4];
  int pseudoElement;
  QStyleOption *in_stack_fffffffffffff510;
  int in_stack_fffffffffffff518;
  int in_stack_fffffffffffff51c;
  QStyleSheetStyle *in_stack_fffffffffffff520;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_ad0;
  QSize local_acc;
  QSize local_ac4;
  QSize local_abc;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_ab4;
  QSize local_ab0;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_aa8;
  QSize local_aa4;
  QSize local_a9c;
  QSize local_a94;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_a8c;
  QSize local_a88;
  QSize local_a80;
  QSize local_a78;
  QSize local_a70;
  QSize local_a68;
  QSize local_a60;
  QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4> local_a58;
  QStyleSheetStyleRecursionGuard local_a51;
  undefined1 local_a50 [136];
  undefined1 local_9c8 [136];
  undefined1 local_940 [136];
  undefined1 local_8b8 [136];
  undefined1 local_830 [1768];
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  undefined1 *puStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  iVar5 = (int)((ulong)in_stack_fffffffffffff4a0 >> 0x20);
  element = (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar6 = baseStyle((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    in_stack_fffffffffffff4ec = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,in_ESI,in_RDX,in_RCX);
    goto LAB_0043bf5a;
  }
  local_a51.guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_a51,in_RDI);
  puVar1 = _local_af8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  pseudoElement = (int)((ulong)_local_af8 >> 0x20);
  renderRule(in_stack_fffffffffffff520,
             (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
             in_stack_fffffffffffff510,pseudoElement);
  _local_af8 = puVar1;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  local_118 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_148 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
  QRenderRule::QRenderRule
            ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
  puVar1 = _local_af8;
  pseudoElement = (int)((ulong)_local_af8 >> 0x20);
  _local_af8 = puVar1;
  switch(in_ESI) {
  case 0:
  case 1:
  case 3:
  case 4:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (!bVar2) goto LAB_0043bef1;
    in_stack_fffffffffffff4ec = 0;
    break;
  case 2:
    pQVar7 = qobject_cast<QToolButton_const*>((QObject *)0x43a5ee);
    puVar1 = _local_af8;
    if (pQVar7 == (QToolButton *)0x0) {
      pseudoElement = (int)((ulong)_local_af8 >> 0x20);
      renderRule(in_stack_fffffffffffff520,
                 (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                 in_stack_fffffffffffff510,pseudoElement);
      _local_af8 = puVar1;
      QRenderRule::operator=
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                 (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      bVar2 = QRenderRule::hasContentsSize
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      if (!bVar2) goto LAB_0043bef1;
      local_a68 = QRenderRule::size((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43a7f9);
    }
    else {
      bVar2 = QRenderRule::hasBox((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      if ((!bVar2) &&
         (bVar2 = QRenderRule::hasNativeBorder
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0)), bVar2))
      {
        pQVar8 = qstyleoption_cast<QStyleOptionToolButton_const*>(in_RDX);
        if (pQVar8 != (QStyleOptionToolButton *)0x0) {
          local_a58.super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i =
               (QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>)
               QFlags<QStyleOptionToolButton::ToolButtonFeature>::operator&
                         ((QFlags<QStyleOptionToolButton::ToolButtonFeature> *)
                          CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                          in_stack_fffffffffffff3dc);
          IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a58);
          puVar1 = _local_af8;
          pseudoElement = (int)((ulong)_local_af8 >> 0x20);
          if (IVar3 == 0) {
            renderRule(in_stack_fffffffffffff520,
                       (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                       in_stack_fffffffffffff510,pseudoElement);
            _local_af8 = puVar1;
            QRenderRule::operator=
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                       (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8))
            ;
            QRenderRule::~QRenderRule
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
            ;
          }
          else {
            renderRule(in_stack_fffffffffffff520,
                       (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                       in_stack_fffffffffffff510,pseudoElement);
            _local_af8 = puVar1;
            QRenderRule::operator=
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                       (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8))
            ;
            QRenderRule::~QRenderRule
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
            ;
          }
          bVar2 = QRenderRule::hasContentsSize
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
          if (bVar2) {
            local_a60 = QRenderRule::size((QRenderRule *)
                                          CONCAT44(in_stack_fffffffffffff3ec,
                                                   in_stack_fffffffffffff3e8));
            in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43a759);
            break;
          }
        }
        goto LAB_0043bef1;
      }
      in_stack_fffffffffffff4ec = 0;
    }
    break;
  case 5:
    bVar2 = QRenderRule::hasNativeBorder
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0))
    ;
    if (bVar2) goto LAB_0043bef1;
    pQVar13 = QRenderRule::border((QRenderRule *)0x43a866);
    in_stack_fffffffffffff4ec = pQVar13->borders[3];
    break;
  default:
    goto LAB_0043bef1;
  case 9:
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    local_a94 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_a94 = QRenderRule::size((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    pQVar11 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar11 == (QStyleOptionSlider *)0x0) {
      iVar5 = QSize::width((QSize *)0x43b0b7);
      if (iVar5 == -1) {
        in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b0c9);
      }
      else {
        in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b0dc);
      }
    }
    else if (pQVar11->orientation == Horizontal) {
      in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b078);
    }
    else {
      in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b08b);
    }
    break;
  case 10:
    bVar2 = hasStyleRule((QStyleSheetStyle *)
                         CONCAT44(in_stack_fffffffffffff424,in_stack_fffffffffffff420),
                         in_stack_fffffffffffff4a8,iVar5);
    puVar1 = _local_af8;
    if (!bVar2) goto LAB_0043bef1;
    pseudoElement = (int)((ulong)_local_af8 >> 0x20);
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    local_a9c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_a9c = QRenderRule::minimumSize
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    pQVar11 = qstyleoption_cast<QStyleOptionSlider_const*>(in_RDX);
    if (pQVar11 == (QStyleOptionSlider *)0x0) {
      iVar5 = QSize::width((QSize *)0x43b20e);
      if (iVar5 == -1) {
        in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b220);
      }
      else {
        in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b233);
      }
    }
    else if (pQVar11->orientation == Horizontal) {
      in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b1cf);
    }
    else {
      in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b1e2);
    }
    break;
  case 0xb:
  case 0xd:
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    local_ab4.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)
                    CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                    in_stack_fffffffffffff3dc);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ab4);
    if (in_ESI == 0xb) {
      local_abc = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_abc = QRenderRule::size((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      if (IVar4 == 0) {
        in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b707);
      }
      else {
        in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b6f4);
      }
    }
    else {
      local_ac4 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_ac4 = QRenderRule::minimumContentsSize
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
      if (IVar4 == 0) {
        in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b774);
      }
      else {
        in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b761);
      }
    }
    break;
  case 0xc:
    memset(local_830,0xaa,0x88);
    puVar1 = _local_af8;
    pseudoElement = (int)((ulong)_local_af8 >> 0x20);
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (bVar2) {
      local_acc = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_acc = QRenderRule::size((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      local_ad0.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           QFlags<QStyle::StateFlag>::operator&
                     ((QFlags<QStyle::StateFlag> *)
                      CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                      in_stack_fffffffffffff3dc);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ad0);
      if (IVar4 == 0) {
        in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b86e);
      }
      else {
        in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b85b);
      }
      local_b3c = 1;
    }
    else {
      local_b3c = 2;
    }
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    goto joined_r0x0043bad0;
  case 0x10:
    memset(local_940,0xaa,0x88);
    puVar1 = _local_af8;
    pseudoElement = (int)((ulong)_local_af8 >> 0x20);
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (bVar2) {
      QRenderRule::size((QRenderRule *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8)
                       );
      QSize::width((QSize *)0x43bb6c);
      QSize::height((QSize *)0x43bb80);
      piVar14 = qMax<int>((int *)&stack0xfffffffffffff51c,(int *)&stack0xfffffffffffff518);
      in_stack_fffffffffffff4ec = *piVar14;
      local_b3c = 1;
    }
    else {
      local_b3c = 2;
    }
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    goto joined_r0x0043bad0;
  case 0x12:
  case 0x42:
    bVar2 = QRenderRule::hasDrawable
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    pQVar13 = QRenderRule::border((QRenderRule *)0x43a98a);
    if (pQVar13 == (QStyleSheetBorderData *)0x0) {
      local_bb8 = 0;
    }
    else {
      pQVar13 = QRenderRule::border((QRenderRule *)0x43a99d);
      local_bb8 = pQVar13->borders[3];
    }
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (bVar2) {
      pQVar9 = QRenderRule::box((QRenderRule *)0x43a9d6);
      local_bc0 = pQVar9->margins[3];
      pQVar9 = QRenderRule::box((QRenderRule *)0x43a9ea);
      local_bc0 = local_bc0 + pQVar9->paddings[3];
    }
    else {
      local_bc0 = 0;
    }
    in_stack_fffffffffffff4ec = local_bb8 + local_bc0;
    break;
  case 0x14:
  case 0x15:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if ((!bVar2) &&
       (bVar2 = QRenderRule::hasBorder
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)), !bVar2))
    goto LAB_0043bef1;
    in_stack_fffffffffffff4ec = 0;
    break;
  case 0x17:
    pQVar12 = qobject_cast<QTabWidget_const*>((QObject *)0x43b5ed);
    if ((pQVar12 == (QTabWidget *)0x0) && (in_RCX != 0)) {
      QWidget::parentWidget((QWidget *)0x43b618);
    }
    bVar2 = hasStyleRule((QStyleSheetStyle *)
                         CONCAT44(in_stack_fffffffffffff424,in_stack_fffffffffffff420),
                         in_stack_fffffffffffff4a8,iVar5);
    if (!bVar2) goto LAB_0043bef1;
    in_stack_fffffffffffff4ec = 0;
    break;
  case 0x18:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    local_aa4 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_aa4 = QRenderRule::size((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    local_aa8.super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorage<QStyle::StateFlag>)
         QFlags<QStyle::StateFlag>::operator&
                   ((QFlags<QStyle::StateFlag> *)
                    CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                    in_stack_fffffffffffff3dc);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_aa8);
    if (IVar4 == 0) {
      in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43b3c9);
    }
    else {
      in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b3b6);
    }
    break;
  case 0x19:
  case 0x35:
  case 0x38:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    local_a88 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_a88 = QRenderRule::size((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    if (in_RDX != (QStyleOption *)0x0) {
      local_a8c.super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorage<QStyle::StateFlag>)
           QFlags<QStyle::StateFlag>::operator&
                     ((QFlags<QStyle::StateFlag> *)
                      CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                      in_stack_fffffffffffff3dc);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_a8c);
      if (IVar4 != 0) {
        in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43ae79);
        break;
      }
    }
    in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43ae8c);
    break;
  case 0x1a:
    memset(local_9c8,0xaa,0x88);
    puVar1 = _local_af8;
    pseudoElement = (int)((ulong)_local_af8 >> 0x20);
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (bVar2) {
      QRenderRule::size((QRenderRule *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8)
                       );
      in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43bc49);
      local_b3c = 1;
    }
    else {
      bVar2 = QRenderRule::hasBox((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      if ((bVar2) ||
         (bVar2 = QRenderRule::hasBorder
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)), bVar2))
      {
        _local_af8 = &DAT_aaaaaaaaaaaaaaaa;
        if (in_RDX == (QStyleOption *)0x0) {
          QWidget::fontMetrics
                    ((QWidget *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
        }
        else {
          QFontMetrics::QFontMetrics(local_af8,&in_RDX->fontMetrics);
        }
        QFontMetrics::height();
        QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                     in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8);
        QRenderRule::size((QRenderRule *)
                          CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                          (QSize *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
        in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43bd19);
        local_b3c = 1;
        QFontMetrics::~QFontMetrics(local_af8);
      }
      else {
        local_b3c = 2;
      }
    }
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    goto joined_r0x0043bad0;
  case 0x1b:
  case 0x1f:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    local_a80 = QRenderRule::size((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43ad42);
    break;
  case 0x1c:
  case 0x24:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (!bVar2) goto LAB_0043bef1;
    pQVar9 = QRenderRule::box((QRenderRule *)0x43abb1);
    in_stack_fffffffffffff4ec = pQVar9->paddings[3];
    break;
  case 0x1d:
  case 0x23:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (!bVar2) goto LAB_0043bef1;
    pQVar9 = QRenderRule::box((QRenderRule *)0x43abf0);
    in_stack_fffffffffffff4ec = pQVar9->paddings[0];
    break;
  case 0x1e:
  case 0x21:
    bVar2 = QRenderRule::hasBorder
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if ((!bVar2) &&
       (bVar2 = QRenderRule::hasBox((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)),
       !bVar2)) goto LAB_0043bef1;
    pQVar13 = QRenderRule::border((QRenderRule *)0x43ab0e);
    if (pQVar13 == (QStyleSheetBorderData *)0x0) {
      in_stack_fffffffffffff4ec = 0;
    }
    else {
      pQVar13 = QRenderRule::border((QRenderRule *)0x43ab21);
      in_stack_fffffffffffff4ec = pQVar13->borders[3];
    }
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (bVar2) {
      pQVar9 = QRenderRule::box((QRenderRule *)0x43ab5a);
      iVar5 = pQVar9->margins[3];
    }
    else {
      iVar5 = 0;
    }
    in_stack_fffffffffffff4ec = in_stack_fffffffffffff4ec + iVar5;
    break;
  case 0x22:
  case 0x36:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if ((!bVar2) || (pQVar9 = QRenderRule::box((QRenderRule *)0x43ac6e), pQVar9->spacing == -1))
    goto LAB_0043bef1;
    pQVar9 = QRenderRule::box((QRenderRule *)0x43ac81);
    in_stack_fffffffffffff4ec = pQVar9->spacing;
    break;
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    if ((in_ESI == 0x27) || (in_ESI == 0x25)) {
      local_a70 = QRenderRule::size((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43a91b);
    }
    else {
      local_a78 = QRenderRule::size((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      in_stack_fffffffffffff4ec = QSize::height((QSize *)0x43a943);
    }
    break;
  case 0x2c:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if ((!bVar2) &&
       (bVar2 = QRenderRule::hasBorder
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)), !bVar2))
    goto LAB_0043bef1;
    pQVar13 = QRenderRule::border((QRenderRule *)0x43bd9d);
    if (pQVar13 == (QStyleSheetBorderData *)0x0) {
      in_stack_fffffffffffff3e4 = 0;
    }
    else {
      pQVar13 = QRenderRule::border((QRenderRule *)0x43bdb0);
      in_stack_fffffffffffff3e4 = pQVar13->borders[3];
    }
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (bVar2) {
      pQVar9 = QRenderRule::box((QRenderRule *)0x43bde9);
      in_stack_fffffffffffff3e0 = pQVar9->paddings[3];
      pQVar9 = QRenderRule::box((QRenderRule *)0x43bdfd);
      in_stack_fffffffffffff3e0 = in_stack_fffffffffffff3e0 + pQVar9->margins[3];
    }
    else {
      in_stack_fffffffffffff3e0 = 0;
    }
    in_stack_fffffffffffff4ec = in_stack_fffffffffffff3e4 + in_stack_fffffffffffff3e0;
    break;
  case 0x2d:
    memset(local_a50,0xaa,0x88);
    renderRule((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffff42c,in_stack_fffffffffffff428),
               in_stack_fffffffffffff4f8,element,
               CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8));
    QRenderRule::size((QRenderRule *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    iVar5 = QSize::width((QSize *)0x43be9d);
    if (iVar5 == -1) {
      local_b3c = 2;
    }
    else {
      local_b3c = 1;
      in_stack_fffffffffffff4ec = iVar5;
    }
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    goto joined_r0x0043bad0;
  case 0x31:
  case 0x32:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (!bVar2) goto LAB_0043bef1;
    in_stack_fffffffffffff4ec = 0;
    break;
  case 0x33:
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    QRenderRule::operator=
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
               (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    bVar2 = QRenderRule::hasContentsSize
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if (!bVar2) goto LAB_0043bef1;
    local_ab0 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_ab0 = QRenderRule::size((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
    iVar5 = QSize::width((QSize *)0x43b50f);
    if (iVar5 == -1) {
      local_bf8 = QSize::height((QSize *)0x43b534);
    }
    else {
      local_bf8 = QSize::width((QSize *)0x43b521);
    }
    in_stack_fffffffffffff4ec = local_bf8 / 2;
    break;
  case 0x34:
    bVar2 = QRenderRule::hasBorder
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0))
    ;
    if ((!bVar2) &&
       (bVar2 = QRenderRule::hasBox((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)),
       !bVar2)) goto LAB_0043bef1;
    pQVar13 = QRenderRule::border((QRenderRule *)0x43aa57);
    if (pQVar13 == (QStyleSheetBorderData *)0x0) {
      local_bc8 = 0;
    }
    else {
      pQVar13 = QRenderRule::border((QRenderRule *)0x43aa6a);
      local_bc8 = pQVar13->borders[3];
    }
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (bVar2) {
      pQVar9 = QRenderRule::box((QRenderRule *)0x43aaa3);
      local_bd0 = pQVar9->paddings[3];
    }
    else {
      local_bd0 = 0;
    }
    in_stack_fffffffffffff4ec = local_bc8 + local_bd0;
    break;
  case 0x37:
  case 0x49:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (!bVar2) goto LAB_0043bef1;
    pQVar9 = QRenderRule::box((QRenderRule *)0x43ac2f);
    in_stack_fffffffffffff4ec = pQVar9->margins[0];
    break;
  case 0x39:
    goto LAB_0043bef1;
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x44:
  case 0x47:
  case 0x48:
    local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
               CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    sh.m_size._4_4_ = in_stack_fffffffffffff3f4;
    sh.m_size._0_4_ = in_stack_fffffffffffff3f0;
    sh.m_data._0_4_ = in_stack_fffffffffffff3f8;
    sh.m_data._4_4_ = in_stack_fffffffffffff3fc;
    QRenderRule::styleHint
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),sh);
    bVar2 = ::QVariant::isValid((QVariant *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if ((bVar2) &&
       (bVar2 = ::QVariant::canConvert<QSize>
                          ((QVariant *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)
                          ), bVar2)) {
      ::QVariant::toSize();
      in_stack_fffffffffffff4ec = QSize::width((QSize *)0x43b974);
      local_b3c = 1;
    }
    else {
      local_b3c = 2;
    }
    ::QVariant::~QVariant((QVariant *)&local_28);
    goto joined_r0x0043bad0;
  case 0x43:
    pQVar10 = qobject_cast<QCheckBox_const*>((QObject *)0x43af0f);
    if (((pQVar10 == (QCheckBox *)0x0) ||
        (bVar2 = QRenderRule::hasBox((QRenderRule *)
                                     CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)),
        !bVar2)) || (pQVar9 = QRenderRule::box((QRenderRule *)0x43af35), pQVar9->spacing == -1)) {
      puVar1 = _local_af8;
      pseudoElement = (int)((ulong)_local_af8 >> 0x20);
      renderRule(in_stack_fffffffffffff520,
                 (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
                 in_stack_fffffffffffff510,pseudoElement);
      _local_af8 = puVar1;
      QRenderRule::operator=
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0),
                 (QRenderRule *)CONCAT44(in_stack_fffffffffffff3dc,in_stack_fffffffffffff3d8));
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      bVar2 = QRenderRule::hasBox((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      if ((!bVar2) || (pQVar9 = QRenderRule::box((QRenderRule *)0x43afd1), pQVar9->spacing == -1))
      goto LAB_0043bef1;
      pQVar9 = QRenderRule::box((QRenderRule *)0x43afe4);
      in_stack_fffffffffffff4ec = pQVar9->spacing;
    }
    else {
      pQVar9 = QRenderRule::box((QRenderRule *)0x43af48);
      in_stack_fffffffffffff4ec = pQVar9->spacing;
    }
    break;
  case 0x46:
    memset(local_8b8,0xaa,0x88);
    puVar1 = _local_af8;
    pseudoElement = (int)((ulong)_local_af8 >> 0x20);
    renderRule(in_stack_fffffffffffff520,
               (QObject *)CONCAT44(in_stack_fffffffffffff51c,in_stack_fffffffffffff518),
               in_stack_fffffffffffff510,pseudoElement);
    _local_af8 = puVar1;
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if (bVar2) {
      pQVar13 = QRenderRule::border((QRenderRule *)0x43ba25);
      if (pQVar13 == (QStyleSheetBorderData *)0x0) {
        in_stack_fffffffffffff4ec = 0;
      }
      else {
        pQVar13 = QRenderRule::border((QRenderRule *)0x43ba38);
        in_stack_fffffffffffff4ec = pQVar13->borders[0];
      }
      bVar2 = QRenderRule::hasBox((QRenderRule *)
                                  CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
      if (bVar2) {
        pQVar9 = QRenderRule::box((QRenderRule *)0x43ba71);
        in_stack_fffffffffffff3ec = pQVar9->margins[0];
        pQVar9 = QRenderRule::box((QRenderRule *)0x43ba85);
        iVar5 = in_stack_fffffffffffff3ec + pQVar9->paddings[0];
      }
      else {
        iVar5 = 0;
      }
      in_stack_fffffffffffff4ec = in_stack_fffffffffffff4ec + iVar5;
      local_b3c = 1;
    }
    else {
      local_b3c = 2;
    }
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
joined_r0x0043bad0:
    if (local_b3c == 2) {
LAB_0043bef1:
      pQVar6 = baseStyle((QStyleSheetStyle *)
                         CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8));
      in_stack_fffffffffffff4ec = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,in_ESI,in_RDX,in_RCX)
      ;
    }
    break;
  case 0x4a:
    bVar2 = QRenderRule::hasBox((QRenderRule *)
                                CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
    if ((!bVar2) || (pQVar9 = QRenderRule::box((QRenderRule *)0x43aed0), pQVar9->spacing == -1))
    goto LAB_0043bef1;
    pQVar9 = QRenderRule::box((QRenderRule *)0x43aee3);
    in_stack_fffffffffffff4ec = pQVar9->spacing;
    break;
  case 0x55:
    bVar2 = QRenderRule::hasNativeBorder
                      ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0))
    ;
    if ((bVar2) &&
       (bVar2 = QRenderRule::hasBox((QRenderRule *)
                                    CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0)),
       !bVar2)) goto LAB_0043bef1;
    in_stack_fffffffffffff4ec = 0;
    break;
  case 0x56:
    pQVar6 = QStyle::proxy((QStyle *)CONCAT44(in_stack_fffffffffffff3f4,in_stack_fffffffffffff3f0));
    iVar5 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x60,in_RDX,in_RCX,0);
    if (iVar5 != 0) goto LAB_0043bef1;
    in_stack_fffffffffffff4ec = 0;
  }
  QRenderRule::~QRenderRule
            ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
  QRenderRule::~QRenderRule
            ((QRenderRule *)CONCAT44(in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0));
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_a51);
LAB_0043bf5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_stack_fffffffffffff4ec;
  }
  __stack_chk_fail();
}

Assistant:

int QStyleSheetStyle::pixelMetric(PixelMetric m, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->pixelMetric(m, opt, w))

    QRenderRule rule = renderRule(w, opt);
    QRenderRule subRule;

    switch (m) {
    case PM_MenuButtonIndicator:
#if QT_CONFIG(toolbutton)
        // QToolButton adds this directly to the width
        if (qobject_cast<const QToolButton *>(w)) {
            if (rule.hasBox() || !rule.hasNativeBorder())
                return 0;
            if (const auto *tbOpt = qstyleoption_cast<const QStyleOptionToolButton*>(opt)) {
                if (tbOpt->features & QStyleOptionToolButton::MenuButtonPopup)
                    subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                else
                    subRule = renderRule(w, opt, PseudoElement_ToolButtonMenuIndicator);
                if (subRule.hasContentsSize())
                    return subRule.size().width();
            }
            break;
        }
#endif
        subRule = renderRule(w, opt, PseudoElement_PushButtonMenuIndicator);
        if (subRule.hasContentsSize())
            return subRule.size().width();
        break;

    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:
    case PM_ButtonMargin:
    case PM_ButtonDefaultIndicator:
        if (rule.hasBox())
            return 0;
        break;

    case PM_DefaultFrameWidth:
        if (!rule.hasNativeBorder())
            return rule.border()->borders[LeftEdge];
        break;

    case PM_ExclusiveIndicatorWidth:
    case PM_IndicatorWidth:
    case PM_ExclusiveIndicatorHeight:
    case PM_IndicatorHeight:
        subRule = renderRule(w, opt, PseudoElement_Indicator);
        if (subRule.hasContentsSize()) {
            return (m == PM_ExclusiveIndicatorWidth) || (m == PM_IndicatorWidth)
                        ? subRule.size().width() : subRule.size().height();
        }
        break;

    case PM_DockWidgetFrameWidth:
    case PM_ToolTipLabelFrameWidth: // border + margin + padding (support only one width)
        if (!rule.hasDrawable())
            break;

        return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                + (rule.hasBox() ? rule.box()->margins[LeftEdge] + rule.box()->paddings[LeftEdge]: 0);

    case PM_ToolBarFrameWidth:
        if (rule.hasBorder() || rule.hasBox())
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->paddings[LeftEdge]: 0);
        break;

    case PM_MenuPanelWidth:
    case PM_MenuBarPanelWidth:
        if (rule.hasBorder() || rule.hasBox())
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->margins[LeftEdge]: 0);
        break;


    case PM_MenuHMargin:
    case PM_MenuBarHMargin:
        if (rule.hasBox())
            return rule.box()->paddings[LeftEdge];
        break;

    case PM_MenuVMargin:
    case PM_MenuBarVMargin:
        if (rule.hasBox())
            return rule.box()->paddings[TopEdge];
        break;

    case PM_DockWidgetTitleBarButtonMargin:
    case PM_ToolBarItemMargin:
        if (rule.hasBox())
            return rule.box()->margins[TopEdge];
        break;

    case PM_ToolBarItemSpacing:
    case PM_MenuBarItemSpacing:
        if (rule.hasBox() && rule.box()->spacing != -1)
            return rule.box()->spacing;
        break;

    case PM_MenuTearoffHeight:
    case PM_MenuScrollerHeight: {
        PseudoElement ps = m == PM_MenuTearoffHeight ? PseudoElement_MenuTearoff : PseudoElement_MenuScroller;
        subRule = renderRule(w, opt, ps);
        if (subRule.hasContentsSize())
            return subRule.size().height();
        break;
                                }

    case PM_ToolBarExtensionExtent:
        break;

    case PM_SplitterWidth:
    case PM_ToolBarSeparatorExtent:
    case PM_ToolBarHandleExtent: {
        PseudoElement ps;
        if (m == PM_ToolBarHandleExtent) ps = PseudoElement_ToolBarHandle;
        else if (m == PM_SplitterWidth) ps = PseudoElement_SplitterHandle;
        else ps = PseudoElement_ToolBarSeparator;
        subRule = renderRule(w, opt, ps);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (opt && opt->state & QStyle::State_Horizontal) ? sz.width() : sz.height();
        }
        break;
                                 }

    case PM_RadioButtonLabelSpacing:
        if (rule.hasBox() && rule.box()->spacing != -1)
            return rule.box()->spacing;
        break;
    case PM_CheckBoxLabelSpacing:
#if QT_CONFIG(checkbox)
        if (qobject_cast<const QCheckBox *>(w)) {
            if (rule.hasBox() && rule.box()->spacing != -1)
                return rule.box()->spacing;
        }
#endif
        // assume group box
        subRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
        if (subRule.hasBox() && subRule.box()->spacing != -1)
            return subRule.box()->spacing;
        break;

#if QT_CONFIG(scrollbar)
    case PM_ScrollBarExtent:
        if (rule.hasContentsSize()) {
            QSize sz = rule.size();
            if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt))
                return sb->orientation == Qt::Horizontal ? sz.height() : sz.width();
            return sz.width() == -1 ? sz.height() : sz.width();
        }
        break;

    case PM_ScrollBarSliderMin:
        if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
            subRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
            QSize msz = subRule.minimumSize();
            if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt))
                return sb->orientation == Qt::Horizontal ? msz.width() : msz.height();
            return msz.width() == -1 ? msz.height() : msz.width();
        }
        break;

    case PM_ScrollView_ScrollBarSpacing:
        if (!rule.hasNativeBorder() || rule.hasBox())
            return 0;
        break;

    case PM_ScrollView_ScrollBarOverlap:
        if (!proxy()->styleHint(SH_ScrollBar_Transient, opt, w))
            return 0;
        break;
#endif // QT_CONFIG(scrollbar)


    case PM_ProgressBarChunkWidth:
        subRule = renderRule(w, opt, PseudoElement_ProgressBarChunk);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (opt->state & QStyle::State_Horizontal)
                   ? sz.width() : sz.height();
        }
        break;

#if QT_CONFIG(tabwidget)
    case PM_TabBarTabHSpace:
    case PM_TabBarTabVSpace:
        subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || subRule.hasBorder())
            return 0;
        break;

    case PM_TabBarScrollButtonWidth:
        subRule = renderRule(w, opt, PseudoElement_TabBarScroller);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (sz.width() != -1 ? sz.width() : sz.height()) / 2;
        }
        break;

    case PM_TabBarTabShiftHorizontal:
    case PM_TabBarTabShiftVertical:
        subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox())
            return 0;
        break;

    case PM_TabBarBaseOverlap: {
        const QWidget *tabWidget = qobject_cast<const QTabWidget *>(w);
        if (!tabWidget && w)
            tabWidget = w->parentWidget();
        if (hasStyleRule(tabWidget, PseudoElement_TabWidgetPane)) {
            return 0;
        }
        break;
    }
#endif // QT_CONFIG(tabwidget)

    case PM_SliderThickness: // horizontal slider's height (sizeHint)
    case PM_SliderLength: // minimum length of slider
        if (rule.hasContentsSize()) {
            bool horizontal = opt->state & QStyle::State_Horizontal;
            if (m == PM_SliderThickness) {
                QSize sz = rule.size();
                return horizontal ? sz.height() : sz.width();
            } else {
                QSize msz = rule.minimumContentsSize();
                return horizontal ? msz.width() : msz.height();
            }
        }
        break;

    case PM_SliderControlThickness: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderHandle);
        if (!subRule.hasContentsSize())
            break;
        QSize size = subRule.size();
        return (opt->state & QStyle::State_Horizontal) ? size.height() : size.width();
                                    }

    case PM_ToolBarIconSize:
    case PM_ListViewIconSize:
    case PM_IconViewIconSize:
    case PM_TabBarIconSize:
    case PM_MessageBoxIconSize:
    case PM_ButtonIconSize:
    case PM_SmallIconSize: {
        const auto styleHint = rule.styleHint("icon-size"_L1);
        if (styleHint.isValid() && styleHint.canConvert<QSize>())
            return styleHint.toSize().width();
        break;
    }
    case PM_DockWidgetTitleMargin: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        if (!subRule.hasBox())
            break;
        return (subRule.border() ? subRule.border()->borders[TopEdge] : 0)
                + (subRule.hasBox() ? subRule.box()->margins[TopEdge] + subRule.box()->paddings[TopEdge]: 0);
                                   }

    case PM_DockWidgetSeparatorExtent: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetSeparator);
        if (!subRule.hasContentsSize())
            break;
        QSize sz = subRule.size();
        return qMax(sz.width(), sz.height());
                                        }

    case PM_TitleBarHeight: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
        if (subRule.hasContentsSize())
            return subRule.size().height();
        else if (subRule.hasBox() || subRule.hasBorder()) {
            QFontMetrics fm = opt ?  opt->fontMetrics : w->fontMetrics();
            return subRule.size(QSize(0, fm.height())).height();
        }
        break;
                            }

    case PM_MdiSubWindowFrameWidth:
        if (rule.hasBox() || rule.hasBorder()) {
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->paddings[LeftEdge]+rule.box()->margins[LeftEdge]: 0);
        }
        break;

    case PM_MdiSubWindowMinimizedWidth: {
        QRenderRule subRule = renderRule(w, PseudoElement_None, PseudoClass_Minimized);
        int width = subRule.size().width();
        if (width != -1)
            return width;
        break;
                                     }
    default:
        break;
    }

    return baseStyle()->pixelMetric(m, opt, w);
}